

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

Clu_Man_t *
Fra_ClausAlloc(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
              int nCutsMax,int nBatches,int fStepUp,int fTarget,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Clu_Man_t *__s;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Clu_Man_t *p;
  int nLevels_local;
  int nLutSize_local;
  int nClausesMax_local;
  int nPref_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  __s = (Clu_Man_t *)malloc(0xb8);
  memset(__s,0,0xb8);
  __s->pAig = pAig;
  __s->nFrames = nFrames;
  __s->nPref = nPref;
  __s->nClausesMax = nClausesMax;
  __s->nLutSize = nLutSize;
  __s->nLevels = nLevels;
  __s->nCutsMax = nCutsMax;
  __s->nBatches = nBatches;
  __s->fStepUp = fStepUp;
  __s->fTarget = fTarget;
  __s->fVerbose = fVerbose;
  __s->fVeryVerbose = fVeryVerbose;
  __s->nSimWords = 0x200;
  __s->nSimFrames = 0x20;
  __s->nSimWordsPref = (__s->nPref * __s->nSimWords) / __s->nSimFrames;
  pVVar2 = Vec_IntAlloc(0x4000);
  __s->vLits = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  __s->vClauses = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  __s->vCosts = pVVar2;
  pVVar2 = Vec_IntAlloc(0x4000);
  __s->vLitsProven = pVVar2;
  pVVar2 = Vec_IntAlloc(0x1000);
  __s->vClausesProven = pVVar2;
  __s->nCexesAlloc = 0x400;
  iVar1 = Aig_ManObjNumMax(__s->pAig);
  pVVar3 = Vec_PtrAllocSimInfo(iVar1 + 1,__s->nCexesAlloc / 0x20);
  __s->vCexes = pVVar3;
  Vec_PtrCleanSimInfo(__s->vCexes,0,__s->nCexesAlloc / 0x20);
  return __s;
}

Assistant:

Clu_Man_t * Fra_ClausAlloc( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    p = ABC_ALLOC( Clu_Man_t, 1 );
    memset( p, 0, sizeof(Clu_Man_t) );
    p->pAig          = pAig;
    p->nFrames       = nFrames;
    p->nPref         = nPref;
    p->nClausesMax   = nClausesMax;
    p->nLutSize      = nLutSize;
    p->nLevels       = nLevels;
    p->nCutsMax      = nCutsMax;
    p->nBatches      = nBatches;
    p->fStepUp       = fStepUp;
    p->fTarget       = fTarget;
    p->fVerbose      = fVerbose;
    p->fVeryVerbose  = fVeryVerbose;
    p->nSimWords     = 512;//1024;//64;
    p->nSimFrames    = 32;//8;//32;
    p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;

    p->vLits         = Vec_IntAlloc( 1<<14 );
    p->vClauses      = Vec_IntAlloc( 1<<12 );
    p->vCosts        = Vec_IntAlloc( 1<<12 );

    p->vLitsProven   = Vec_IntAlloc( 1<<14 );
    p->vClausesProven= Vec_IntAlloc( 1<<12 );

    p->nCexesAlloc   = 1024;
    p->vCexes        = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pAig)+1, p->nCexesAlloc/32 );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    return p;
}